

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

CURLcode Curl_hsts_loadfile(Curl_easy *data,hsts *h,char *file)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  char *pcVar4;
  stsentry *psVar5;
  char *pcVar6;
  CURLcode CVar7;
  time_t expires;
  bool subdomain;
  char date [65];
  char host [257];
  long local_188;
  short local_180;
  char local_138 [264];
  
  (*Curl_cfree)(h->filename);
  pcVar3 = (*Curl_cstrdup)(file);
  h->filename = pcVar3;
  if (pcVar3 == (char *)0x0) {
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  else {
    __stream = fopen64(file,"r");
    if (__stream == (FILE *)0x0) {
      CVar7 = CURLE_OK;
    }
    else {
      pcVar3 = (char *)(*Curl_cmalloc)(0xfff);
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)(h->filename);
        h->filename = (char *)0x0;
        CVar7 = CURLE_OUT_OF_MEMORY;
      }
      else {
        pcVar4 = Curl_get_line(pcVar3,0xfff,(FILE *)__stream);
        if (pcVar4 != (char *)0x0) {
          pcVar4 = pcVar3;
          do {
            while( true ) {
              cVar1 = *pcVar4;
              if (cVar1 != '\t') break;
LAB_006f0c8b:
              pcVar4 = pcVar4 + 1;
            }
            if (cVar1 != '#') {
              if (cVar1 == ' ') goto LAB_006f0c8b;
              iVar2 = __isoc99_sscanf(pcVar4,"%256s \"%64[^\"]\"",local_138,&local_188);
              if (iVar2 == 2) {
                expires = 0x7fffffffffffffff;
                if (local_180 != 100 || local_188 != 0x6574696d696c6e75) {
                  expires = Curl_getdate_capped((char *)&local_188);
                }
                cVar1 = local_138[0];
                subdomain = local_138[0] == '.';
                psVar5 = Curl_hsts(h,local_138 + subdomain,subdomain);
                if (psVar5 == (stsentry *)0x0) {
                  hsts_create(h,local_138 + subdomain,cVar1 == '.',expires);
                }
                else if (psVar5->expires < expires) {
                  psVar5->expires = expires;
                }
              }
            }
            pcVar6 = Curl_get_line(pcVar3,0xfff,(FILE *)__stream);
            pcVar4 = pcVar3;
          } while (pcVar6 != (char *)0x0);
        }
        (*Curl_cfree)(pcVar3);
        CVar7 = CURLE_OK;
      }
      fclose(__stream);
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_hsts_loadfile(struct Curl_easy *data,
                            struct hsts *h, const char *file)
{
  DEBUGASSERT(h);
  (void)data;
  return hsts_load(h, file);
}